

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O0

void Cba_NtkPrintNodes(Cba_Ntk_t *p,int Type)

{
  int iVar1;
  Cba_ObjType_t CVar2;
  int i_00;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  char *local_338;
  char *local_328;
  char *local_2f8;
  char *pTypeNames [90];
  int Counter;
  int iFon1;
  int iFon0;
  int i;
  int Type_local;
  Cba_Ntk_t *p_local;
  
  pTypeNames[0x59]._4_4_ = 0;
  Cba_ManCreatePrimMap(&local_2f8);
  printf("Operation %s\n",pTypeNames[(long)Type + -1]);
  for (iFon1 = 1; iVar1 = Vec_StrSize(&p->vObjType), iFon1 < iVar1; iFon1 = iFon1 + 1) {
    CVar2 = Cba_ObjType(p,iFon1);
    if (CVar2 != CBA_OBJ_NONE) {
      iVar1 = Cba_ObjFinFon(p,iFon1,0);
      i_00 = Cba_ObjFinFon(p,iFon1,1);
      pTypeNames[0x59]._4_4_ = pTypeNames[0x59]._4_4_ + 1;
      printf("%8d  :");
      printf("%8d  :  ",(ulong)(uint)iFon1);
      uVar3 = Cba_ObjRangeSize(p,iFon1);
      iVar4 = Cba_ObjSigned(p,iFon1);
      pcVar5 = " ";
      if (iVar4 != 0) {
        pcVar5 = "s";
      }
      printf("%3d%s = ",(ulong)uVar3,pcVar5);
      iVar4 = Cba_ObjFinFon(p,iFon1,0);
      uVar3 = Cba_ObjRangeSize(p,iVar4);
      iVar4 = Cba_ObjSigned(p,iVar1);
      pcVar5 = " ";
      if (iVar4 != 0) {
        pcVar5 = "s";
      }
      printf("%3d%s  %s ",(ulong)uVar3,pcVar5,pTypeNames[(long)Type + -1]);
      iVar4 = Cba_ObjFinFon(p,iFon1,1);
      uVar3 = Cba_ObjRangeSize(p,iVar4);
      iVar4 = Cba_ObjSigned(p,i_00);
      pcVar5 = " ";
      if (iVar4 != 0) {
        pcVar5 = "s";
      }
      printf("%3d%s ",(ulong)uVar3,pcVar5);
      printf(" :    ");
      pcVar5 = Cba_ObjNameStr(p,iFon1);
      printf("%-12s =  ",pcVar5);
      iVar4 = Cba_FonIsConst(iVar1);
      if (iVar4 == 0) {
        local_328 = Cba_FonNameStr(p,iVar1);
      }
      else {
        iVar1 = Cba_FonConst(iVar1);
        local_328 = Cba_NtkConst(p,iVar1);
      }
      printf("%-12s  %s  ",local_328,pTypeNames[(long)Type + -1]);
      iVar1 = Cba_FonIsConst(i_00);
      if (iVar1 == 0) {
        local_338 = Cba_FonNameStr(p,i_00);
      }
      else {
        iVar1 = Cba_FonConst(i_00);
        local_338 = Cba_NtkConst(p,iVar1);
      }
      printf("%-12s ",local_338);
      printf("\n");
    }
  }
  return;
}

Assistant:

void Cba_NtkPrintNodes( Cba_Ntk_t * p, int Type )
{
    int i, iFon0, iFon1, Counter = 0;
    char * pTypeNames[CBA_BOX_LAST];
    Cba_ManCreatePrimMap( pTypeNames );
    printf( "Operation %s\n", pTypeNames[Type] );
    Cba_NtkForEachObj( p, i )
    {
        if ( (int)Type != Type )
            continue;
        iFon0 = Cba_ObjFinFon(p, i, 0);
        iFon1 = Cba_ObjFinFon(p, i, 1);

        printf( "%8d  :",      Counter++ );
        printf( "%8d  :  ",    i );
        printf( "%3d%s = ",    Cba_ObjRangeSize(p, i),                      Cba_ObjSigned(p, i) ? "s" : " " );
        printf( "%3d%s  %s ",  Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)), Cba_ObjSigned(p, iFon0) ? "s" : " ", pTypeNames[Type] );
        printf( "%3d%s ",      Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 1)), Cba_ObjSigned(p, iFon1) ? "s" : " " );
        printf( " :    " );
        printf( "%-12s =  ",   Cba_ObjNameStr(p, i) );
        printf( "%-12s  %s  ", Cba_FonIsConst(iFon0) ? Cba_NtkConst(p, Cba_FonConst(iFon0)) : Cba_FonNameStr(p, iFon0), pTypeNames[Type] );
        printf( "%-12s ",      Cba_FonIsConst(iFon1) ? Cba_NtkConst(p, Cba_FonConst(iFon1)) : Cba_FonNameStr(p, iFon1) );
        printf( "\n" );
    }
}